

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_SimpleArray<void_*>::Append(ON_SimpleArray<void_*> *this,void **x)

{
  int iVar1;
  void *pvVar2;
  void **memblock;
  int iVar3;
  uint uVar4;
  
  iVar1 = *(int *)(this + 0x10);
  memblock = x;
  if (iVar1 == *(int *)(this + 0x14)) {
    if (iVar1 < 8 || (ulong)((long)iVar1 * 8) < 0x10000001) {
      uVar4 = 4;
      if (2 < iVar1) {
        uVar4 = iVar1 * 2;
      }
    }
    else {
      iVar3 = 0x2000008;
      if (iVar1 < 0x2000008) {
        iVar3 = iVar1;
      }
      uVar4 = iVar3 + iVar1;
    }
    if (x < *(void ***)(this + 8) + *(int *)(this + 0x14) && *(void ***)(this + 8) <= x) {
      memblock = (void **)onmalloc(8);
      *memblock = *x;
    }
    if (*(uint *)(this + 0x14) < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
    if (*(long *)(this + 8) == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pvVar2 = *memblock;
  iVar1 = *(int *)(this + 0x10);
  *(int *)(this + 0x10) = iVar1 + 1;
  *(void **)(*(long *)(this + 8) + (long)iVar1 * 8) = pvVar2;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}